

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

void * lws_protocol_vh_priv_zalloc(lws_vhost *vhost,lws_protocols *prot,int size)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  bool bVar4;
  int local_28;
  int n;
  int size_local;
  lws_protocols *prot_local;
  lws_vhost *vhost_local;
  
  local_28 = 0;
  if (vhost->protocol_vh_privs == (void **)0x0) {
    ppvVar2 = (void **)lws_zalloc((long)vhost->count_protocols << 3,"protocol_vh_privs");
    vhost->protocol_vh_privs = ppvVar2;
    if (vhost->protocol_vh_privs == (void **)0x0) {
      return (void *)0x0;
    }
  }
  while( true ) {
    bVar4 = false;
    if (local_28 < vhost->count_protocols) {
      bVar4 = vhost->protocols + local_28 != prot;
    }
    if (!bVar4) break;
    local_28 = local_28 + 1;
  }
  if (local_28 == vhost->count_protocols) {
    local_28 = 0;
    while( true ) {
      bVar4 = false;
      if (local_28 < vhost->count_protocols) {
        iVar1 = strcmp(vhost->protocols[local_28].name,prot->name);
        bVar4 = iVar1 != 0;
      }
      if (!bVar4) break;
      local_28 = local_28 + 1;
    }
    if (local_28 == vhost->count_protocols) {
      return (void *)0x0;
    }
  }
  pvVar3 = lws_zalloc((long)size,"vh priv");
  vhost->protocol_vh_privs[local_28] = pvVar3;
  return vhost->protocol_vh_privs[local_28];
}

Assistant:

void *
lws_protocol_vh_priv_zalloc(struct lws_vhost *vhost,
			    const struct lws_protocols *prot, int size)
{
	int n = 0;

	/* allocate the vh priv array only on demand */
	if (!vhost->protocol_vh_privs) {
		vhost->protocol_vh_privs = (void **)lws_zalloc(
				vhost->count_protocols * sizeof(void *),
				"protocol_vh_privs");
		if (!vhost->protocol_vh_privs)
			return NULL;
	}

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols &&
		       strcmp(vhost->protocols[n].name, prot->name))
			n++;

		if (n == vhost->count_protocols)
			return NULL;
	}

	vhost->protocol_vh_privs[n] = lws_zalloc(size, "vh priv");
	return vhost->protocol_vh_privs[n];
}